

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O3

void __thiscall QSqlRelationalTableModelPrivate::clearChanges(QSqlRelationalTableModelPrivate *this)

{
  QRelation *pQVar1;
  iterator iVar2;
  iterator iVar3;
  QSharedPointer<QRelation> *rel;
  
  iVar2 = QList<QSharedPointer<QRelation>_>::begin(&this->relations);
  iVar3 = QList<QSharedPointer<QRelation>_>::end(&this->relations);
  for (; iVar2.i != iVar3.i; iVar2.i = iVar2.i + 1) {
    pQVar1 = ((iVar2.i)->value).ptr;
    if (pQVar1->model != (QRelatedTableModel *)0x0) {
      (**(code **)(*(long *)&(pQVar1->model->super_QSqlTableModel).super_QSqlQueryModel + 0x20))();
    }
    pQVar1->model = (QRelatedTableModel *)0x0;
    QHash<QString,_QVariant>::clear(&pQVar1->dictionary);
    pQVar1->m_dictInitialized = false;
  }
  return;
}

Assistant:

void QSqlRelationalTableModelPrivate::clearChanges()
{
    for (auto &rel : relations)
        rel->clear();
}